

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdtFunc.h
# Opt level: O0

void SDT::commonCal(TreeNode *treeNode,SDTNode *fa,SDTNode *now,string *code)

{
  int line;
  bool bVar1;
  Elist *pEVar2;
  reference pvVar3;
  reference pvVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  allocator local_191;
  string local_190 [32];
  __cxx11 local_170 [39];
  allocator local_149;
  string local_148 [32];
  __cxx11 local_128 [8];
  string p;
  allocator local_101;
  string local_100 [39];
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [32];
  reference local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string local_68 [4];
  int n;
  Elist *local_48 [3];
  Elist *local_30;
  Elist *elist_1;
  string *code_local;
  SDTNode *now_local;
  SDTNode *fa_local;
  TreeNode *treeNode_local;
  
  elist_1 = (Elist *)code;
  code_local = (string *)now;
  now_local = fa;
  fa_local = (SDTNode *)treeNode;
  pEVar2 = (Elist *)operator_new(0x40);
  Elist::Elist(pEVar2);
  local_48[0] = pEVar2;
  local_30 = pEVar2;
  std::vector<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>::push_back
            ((vector<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_> *)(code_local + 8),
             (value_type *)local_48);
  pEVar2 = local_30;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)fa_local,3);
  pvVar4 = std::vector<TreeNode,_std::allocator<TreeNode>_>::operator[](&resultTree,(long)*pvVar3);
  (**(pEVar2->super_SDTNode)._vptr_SDTNode)(pEVar2,pvVar4,code_local);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)fa_local,1);
  pvVar4 = std::vector<TreeNode,_std::allocator<TreeNode>_>::operator[](&resultTree,(long)*pvVar3);
  sVar5 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *)funcs_abi_cxx11_,&pvVar4->attr);
  if (sVar5 == 0) {
    line = *(int *)&fa_local[2].sons.
                    super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)fa_local,1);
    std::vector<TreeNode,_std::allocator<TreeNode>_>::operator[](&resultTree,(long)*pvVar3);
    std::operator+((char *)local_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Function not declared ");
    ERROR(line,local_68);
    std::__cxx11::string::~string((string *)local_68);
  }
  else {
    __range1._4_4_ = 0;
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)q_abi_cxx11_);
    t = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)q_abi_cxx11_);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&t);
      if (!bVar1) break;
      local_90 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end1);
      __range1._4_4_ = __range1._4_4_ + 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b0,"param",&local_b1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d8,"_",&local_d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_100,"_",&local_101);
      gen((string *)local_b0,(string *)local_d8,(string *)local_100,local_90);
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
      std::__cxx11::string::~string(local_d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_d9);
      std::__cxx11::string::~string(local_b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)fa_local,1);
    pvVar4 = std::vector<TreeNode,_std::allocator<TreeNode>_>::operator[](&resultTree,(long)*pvVar3)
    ;
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           *)funcs_abi_cxx11_,&pvVar4->attr);
    std::__cxx11::to_string(local_128,*pmVar6);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_148,"call",&local_149);
    std::__cxx11::to_string(local_170,__range1._4_4_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_190,"_",&local_191);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)fa_local,1);
    pvVar4 = std::vector<TreeNode,_std::allocator<TreeNode>_>::operator[](&resultTree,(long)*pvVar3)
    ;
    gen((string *)local_148,(string *)local_170,(string *)local_190,&pvVar4->attr);
    std::__cxx11::string::~string(local_190);
    std::allocator<char>::~allocator((allocator<char> *)&local_191);
    std::__cxx11::string::~string((string *)local_170);
    std::__cxx11::string::~string(local_148);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
    std::__cxx11::string::~string((string *)local_128);
  }
  return;
}

Assistant:

void commonCal(TreeNode &treeNode,SDTNode *fa,SDTNode *now,string &code){
        Elist *elist_1 = new Elist;
        now->sons.push_back(elist_1);
        elist_1->dfs(resultTree[treeNode.sons[3]],now);
        if(!funcs.count(TNAME(1))){
            ERROR(treeNode.lineNum ,"Function not declared "+TNAME(1));
            return;
        }
        int n = 0;
        for(auto &t:q){
            n++;
            gen("param","_","_",t);
        }
        string p = to_string(funcs[TNAME(1)]);
        gen("call",to_string(n),"_",TNAME(1));
    }